

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::BlendA64Mask1DTest8B::~BlendA64Mask1DTest8B(BlendA64Mask1DTest8B *this)

{
  anon_unknown.dwarf_10310e3::BlendA64Mask1DTest8B::~BlendA64Mask1DTest8B
            ((BlendA64Mask1DTest8B *)(this + -0x10));
  return;
}

Assistant:

void Execute(const uint8_t *p_src0, const uint8_t *p_src1) override {
    params_.ref_func(dst_ref_ + dst_offset_, dst_stride_, p_src0 + src0_offset_,
                     src0_stride_, p_src1 + src1_offset_, src1_stride_, mask_,
                     w_, h_);
    API_REGISTER_STATE_CHECK(params_.tst_func(
        dst_tst_ + dst_offset_, dst_stride_, p_src0 + src0_offset_,
        src0_stride_, p_src1 + src1_offset_, src1_stride_, mask_, w_, h_));
  }